

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::AssetPath> *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  bool triple_deliminated;
  AssetPath v;
  bool local_69;
  AssetPath local_68;
  
  bVar3 = MaybeNone(this);
  if (bVar3) {
    if (value->has_value_ == true) {
      nonstd::optional_lite::detail::storage_t<tinyusdz::value::AssetPath>::destruct_value
                ((storage_t<tinyusdz::value::AssetPath> *)&value->contained);
    }
    value->has_value_ = false;
    bVar3 = true;
  }
  else {
    paVar1 = &local_68.asset_path_.field_2;
    local_68.asset_path_._M_string_length = 0;
    local_68.asset_path_.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_68.resolved_path_.field_2;
    local_68.resolved_path_._M_string_length = 0;
    local_68.resolved_path_.field_2._M_local_buf[0] = '\0';
    local_68.asset_path_._M_dataplus._M_p = (pointer)paVar1;
    local_68.resolved_path_._M_dataplus._M_p = (pointer)paVar2;
    bVar3 = ParseAssetIdentifier(this,&local_68,&local_69);
    if (bVar3) {
      nonstd::optional_lite::optional<tinyusdz::value::AssetPath>::operator=(value,&local_68);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.resolved_path_._M_dataplus._M_p != paVar2) {
      operator_delete(local_68.resolved_path_._M_dataplus._M_p,
                      CONCAT71(local_68.resolved_path_.field_2._M_allocated_capacity._1_7_,
                               local_68.resolved_path_.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.asset_path_._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.asset_path_._M_dataplus._M_p,
                      CONCAT71(local_68.asset_path_.field_2._M_allocated_capacity._1_7_,
                               local_68.asset_path_.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar3;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::AssetPath> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::AssetPath v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}